

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

UChar32 anon_unknown.dwarf_2b6ba1::getRange
                  (void *t,UChar32 start,UCPMapValueFilter *filter,void *context,uint32_t *pValue)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  UCPTrieValueWidth valueWidth;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int dataIndex;
  UChar32 UVar17;
  uint32_t local_98;
  uint local_90;
  
  if ((uint)start < 0x110000) {
    valueWidth = (UCPTrieValueWidth)*(char *)((long)t + 0x1f);
    if (start < *(int *)((long)t + 0x18)) {
      uVar5 = *(uint32_t *)((long)t + 0x2c);
      if (filter != (UCPMapValueFilter *)0x0) {
        uVar5 = (*filter)(context,uVar5);
      }
      lVar3 = *t;
      uVar6 = 0xffffffff;
      bVar4 = false;
      local_90 = 0xffffffff;
      uVar14 = start;
      do {
        iVar13 = 0x10;
        lVar12 = 0x20;
        cVar1 = *(char *)((long)t + 0x1e);
        if (((int)uVar14 < 0x10000) && ((int)uVar14 < 0x1000 || cVar1 == '\0')) {
          uVar9 = (int)uVar14 >> 6;
          lVar12 = 0x40;
          if (cVar1 == '\0') {
            lVar12 = 0x400;
          }
          uVar10 = 0;
          iVar13 = 0x40;
LAB_002ba863:
          lVar11 = (long)(int)uVar9;
          do {
            if (uVar10 < 0x8000) {
              uVar9 = (uint)*(ushort *)(lVar3 + (ulong)uVar10 * 2 + lVar11 * 2);
            }
            else {
              uVar9 = (uint)lVar11;
              iVar15 = ((int)uVar9 >> 3) + (uVar9 & 0xfffffff8) + (uVar10 & 0x7fff);
              uVar9 = (uint)*(ushort *)(lVar3 + (long)(int)((uVar9 & 7) + iVar15 + 1) * 2) |
                      (uint)*(ushort *)(lVar3 + (long)iVar15 * 2) << (char)(uVar9 & 7) * '\x02' + 2
                      & 0x30000;
            }
            if ((uVar9 == uVar6) && (iVar13 <= (int)(uVar14 - start))) {
              uVar14 = uVar14 + iVar13;
            }
            else {
              uVar6 = uVar9;
              if (uVar9 == *(uint *)((long)t + 0x28)) {
                if (bVar4) {
                  if (uVar5 != local_98) goto LAB_002bab19;
                }
                else {
                  bVar4 = true;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar5;
                  }
                }
                uVar14 = uVar14 + iVar13 & -iVar13;
                local_98 = uVar5;
              }
              else {
                uVar16 = uVar14 & iVar13 - 1U;
                uVar7 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth,uVar9 + uVar16);
                uVar8 = uVar7;
                if (uVar7 == *(uint32_t *)((long)t + 0x2c)) {
                  uVar8 = uVar5;
                }
                if ((filter != (UCPMapValueFilter *)0x0) && (uVar7 != *(uint32_t *)((long)t + 0x2c))
                   ) {
                  uVar8 = (*filter)(context,uVar7);
                }
                if (bVar4) {
                  if (uVar8 != local_98) goto LAB_002bab19;
                }
                else {
                  bVar4 = true;
                  local_98 = uVar8;
                  if (pValue != (uint32_t *)0x0) {
                    *pValue = uVar8;
                  }
                }
                iVar15 = uVar14 - 1;
                dataIndex = uVar16 + uVar9;
                while( true ) {
                  dataIndex = dataIndex + 1;
                  uVar14 = iVar15 + 2;
                  if ((iVar13 - 1U & uVar14) == 0) break;
                  uVar7 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth,dataIndex);
                  uVar8 = uVar7;
                  if (uVar7 == *(uint32_t *)((long)t + 0x2c)) {
                    uVar8 = uVar5;
                  }
                  if ((filter != (UCPMapValueFilter *)0x0) &&
                     (uVar7 != *(uint32_t *)((long)t + 0x2c))) {
                    uVar8 = (*filter)(context,uVar7);
                  }
                  iVar15 = iVar15 + 1;
                  if (uVar8 != local_98) {
                    return iVar15;
                  }
                }
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < lVar12);
        }
        else {
          uVar10 = (uVar14 >> 0xe) + 0x3fc;
          if (cVar1 != '\0') {
            uVar10 = (uVar14 >> 0xe) + 0x40;
          }
          uVar2 = *(ushort *)
                   (*t + (ulong)((uVar14 >> 9 & 0x1f) + (uint)*(ushort *)(*t + (ulong)uVar10 * 2)) *
                         2);
          uVar10 = (uint)uVar2;
          if ((local_90 == uVar10) && (0x1ff < (int)(uVar14 - start))) {
            uVar14 = uVar14 + 0x200;
          }
          else {
            local_90 = uVar10;
            if (uVar2 != *(ushort *)((long)t + 0x26)) {
              uVar9 = uVar14 >> 4 & 0x1f;
              goto LAB_002ba863;
            }
            if (bVar4) {
              if (uVar5 != local_98) {
LAB_002bab19:
                return uVar14 - 1;
              }
            }
            else {
              bVar4 = true;
              if (pValue != (uint32_t *)0x0) {
                *pValue = uVar5;
              }
            }
            uVar6 = *(uint *)((long)t + 0x28);
            uVar14 = (uVar14 & 0xfffffe00) + 0x200;
            local_98 = uVar5;
          }
        }
      } while ((int)uVar14 < *(int *)((long)t + 0x18));
      uVar8 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth,*(int *)((long)t + 0x14) + -2);
      if (uVar8 != *(uint32_t *)((long)t + 0x2c)) {
        uVar5 = uVar8;
      }
      if ((filter != (UCPMapValueFilter *)0x0) && (uVar8 != *(uint32_t *)((long)t + 0x2c))) {
        uVar5 = (*filter)(context,uVar8);
      }
      UVar17 = 0x10ffff;
      if (uVar5 != local_98) {
        UVar17 = uVar14 - 1;
      }
    }
    else {
      UVar17 = 0x10ffff;
      if (pValue != (uint32_t *)0x0) {
        uVar5 = getValue(*(UCPTrieData *)((long)t + 8),valueWidth,*(int *)((long)t + 0x14) + -2);
        if (filter != (UCPMapValueFilter *)0x0) {
          uVar5 = (*filter)(context,uVar5);
        }
        *pValue = uVar5;
      }
    }
  }
  else {
    UVar17 = -1;
  }
  return UVar17;
}

Assistant:

UChar32 getRange(const void *trie, UChar32 start,
                 UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    return reinterpret_cast<const MutableCodePointTrie *>(trie)->
        getRange(start, filter, context, pValue);
}